

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

void chaiscript::dispatch::detail::
     call_func<void(*)(std::__cxx11::string&,int,char_const&),void,std::__cxx11::string&,int,char_const&,0ul,1ul,2ul>
               (undefined8 param_1,undefined8 *param_2,Function_Params *param_3,
               Type_Conversions_State *param_4)

{
  code *pcVar1;
  int iVar2;
  Boxed_Value *pBVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int_char_ptr
  **f_local;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int_char_ptr
  *param_0_local;
  
  pcVar1 = (code *)*param_2;
  pBVar3 = Function_Params::operator[](param_3,0);
  pbVar4 = boxed_cast<std::__cxx11::string&>(pBVar3,param_4);
  pBVar3 = Function_Params::operator[](param_3,1);
  iVar2 = boxed_cast<int>(pBVar3,param_4);
  pBVar3 = Function_Params::operator[](param_3,2);
  pcVar5 = boxed_cast<char_const&>(pBVar3,param_4);
  (*pcVar1)(pbVar4,iVar2,pcVar5);
  return;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }